

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O3

bool __thiscall
OpenMesh::IO::_OMReader_::read_binary(_OMReader_ *this,istream *_is,BaseImporter *_bi,Options *_opt)

{
  ChunkHeader *hdr;
  bool bVar1;
  size_t sVar2;
  bool _swap;
  ChunkHeader CVar3;
  uint uVar4;
  Options *pOVar5;
  undefined1 *local_70;
  uint16 val;
  undefined1 local_60 [16];
  PropertyName *local_50;
  Options *local_48;
  _OMReader_ *local_40;
  BaseImporter *local_38;
  
  _swap = Endian::local_ == 2 || (~_opt->flags_ & 6U) == 0;
  this->bytes_ = 0;
  local_48 = _opt;
  local_38 = _bi;
  sVar2 = OMFormat::Header::restore(&this->header_,_is,_swap);
  this->bytes_ = this->bytes_ + sVar2;
  if (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) == 0) {
    hdr = &this->chunk_header_;
    local_50 = &this->property_name_;
    local_40 = this;
    do {
      sVar2 = binary<unsigned_short>::restore(_is,(value_type *)&local_70,_swap);
      OMFormat::operator<<(hdr,(uint16)local_70);
      local_40->bytes_ = local_40->bytes_ + sVar2;
      if (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) != 0) break;
      CVar3 = *hdr;
      if (((uint)CVar3 & 2) != 0) {
        _val = 0;
        local_60[0] = 0;
        local_70 = local_60;
        sVar2 = restore<OpenMesh::IO::OMFormat::Chunk::PropertyName>(_is,local_50,_swap);
        local_40->bytes_ = local_40->bytes_ + sVar2;
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        CVar3 = *hdr;
      }
      uVar4 = (uint)CVar3 >> 2 & 7;
      bVar1 = false;
      if (6 < uVar4) {
        return false;
      }
      pOVar5 = (Options *)
               ((long)&switchD_00178314::switchdataD_001a46c4 +
               (long)(int)(&switchD_00178314::switchdataD_001a46c4)[uVar4]);
      switch(uVar4) {
      case 0:
        bVar1 = read_binary_vertex_chunk(local_40,_is,local_38,local_48,_swap);
        break;
      case 1:
        bVar1 = read_binary_mesh_chunk(local_40,_is,local_38,pOVar5,_swap);
        break;
      case 2:
        bVar1 = read_binary_face_chunk(local_40,_is,local_38,local_48,_swap);
        break;
      default:
        goto switchD_00178314_caseD_3;
      case 4:
        bVar1 = read_binary_edge_chunk(local_40,_is,local_38,pOVar5,_swap);
        break;
      case 6:
        bVar1 = read_binary_halfedge_chunk(local_40,_is,local_38,pOVar5,_swap);
      }
      if (bVar1 == false) {
        return false;
      }
    } while (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) == 0);
  }
  bVar1 = true;
switchD_00178314_caseD_3:
  return bVar1;
}

Assistant:

bool _OMReader_::read_binary(std::istream& _is, BaseImporter& _bi, Options& _opt) const
{
  bool swap = _opt.check(Options::Swap) || (Endian::local() == Endian::MSB);

  // Initialize byte counter
  bytes_ = 0;

  bytes_ += restore(_is, header_, swap);


  while (!_is.eof()) {
    bytes_ += restore(_is, chunk_header_, swap);

    if (_is.eof())
      break;

    // Is this a named property restore the name
    if (chunk_header_.name_) {
      OMFormat::Chunk::PropertyName pn;
      bytes_ += restore(_is, property_name_, swap);
    }

    // Read in the property data. If it is an anonymous or unknown named
    // property, then skip data.
    switch (chunk_header_.entity_) {
      case OMFormat::Chunk::Entity_Vertex:
        if (!read_binary_vertex_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Face:
        if (!read_binary_face_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Edge:
        if (!read_binary_edge_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Halfedge:
        if (!read_binary_halfedge_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Mesh:
        if (!read_binary_mesh_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      default:
        return false;
    }

  }

  // File was successfully parsed.
  return true;
}